

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.hpp
# Opt level: O3

Image4u * eos::render::render(Image4u *__return_storage_ptr__,Mesh *mesh,Matrix4f *model_view_matrix
                             ,Matrix4f *projection_matrix,int viewport_width,int viewport_height,
                             Texture *texture,bool enable_backface_culling,bool enable_near_clipping
                             ,bool enable_far_clipping)

{
  SoftwareRenderer<eos::render::VertexShader,_eos::render::TexturingFragmentShader>
  software_renderer;
  optional<eos::render::Texture> local_f0;
  SoftwareRenderer<eos::render::VertexShader,_eos::render::TexturingFragmentShader> local_c8;
  
  local_c8.texture.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
  super__Optional_payload<eos::render::Texture,_true,_false,_false>.
  super__Optional_payload_base<eos::render::Texture>._M_engaged = false;
  local_c8.enable_backface_culling = false;
  local_c8.enable_near_clipping = true;
  local_c8.rasterizer.enable_depth_test = true;
  local_c8.rasterizer.perspective_correct_barycentric_weights = true;
  local_c8.rasterizer.enable_far_clipping = true;
  local_c8.rasterizer.colorbuffer.height_ = 0;
  local_c8.rasterizer.colorbuffer.width_ = 0;
  local_c8.rasterizer.colorbuffer.row_stride = 0;
  local_c8.rasterizer.depthbuffer.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.rasterizer.depthbuffer.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.rasterizer.depthbuffer.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c8.rasterizer.colorbuffer.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.rasterizer.colorbuffer.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.rasterizer.colorbuffer.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c8.rasterizer.depthbuffer.height_ = 0;
  local_c8.rasterizer.depthbuffer.width_ = 0;
  local_c8.rasterizer.depthbuffer.row_stride = 0;
  local_c8.rasterizer.viewport_width = viewport_width;
  local_c8.rasterizer.viewport_height = viewport_height;
  Rasterizer<eos::render::TexturingFragmentShader>::clear_buffers(&local_c8.rasterizer);
  local_c8.enable_near_clipping = enable_near_clipping;
  local_c8.enable_backface_culling = enable_backface_culling;
  local_c8.rasterizer.enable_far_clipping = enable_far_clipping;
  std::
  vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
  ::vector((vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
            *)&local_f0,&texture->mipmaps);
  local_f0.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
  super__Optional_payload<eos::render::Texture,_true,_false,_false>.
  super__Optional_payload_base<eos::render::Texture>._M_payload._24_1_ = texture->widthLog;
  local_f0.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
  super__Optional_payload<eos::render::Texture,_true,_false,_false>.
  super__Optional_payload_base<eos::render::Texture>._M_payload._25_1_ = texture->heightLog;
  local_f0.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
  super__Optional_payload<eos::render::Texture,_true,_false,_false>.
  super__Optional_payload_base<eos::render::Texture>._M_payload._26_2_ =
       *(undefined2 *)&texture->field_0x1a;
  local_f0.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
  super__Optional_payload<eos::render::Texture,_true,_false,_false>.
  super__Optional_payload_base<eos::render::Texture>._M_payload._28_4_ = texture->mipmaps_num;
  local_f0.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
  super__Optional_payload<eos::render::Texture,_true,_false,_false>.
  super__Optional_payload_base<eos::render::Texture>._M_engaged = true;
  SoftwareRenderer<eos::render::VertexShader,_eos::render::TexturingFragmentShader>::render<float>
            (__return_storage_ptr__,&local_c8,mesh,model_view_matrix,projection_matrix,&local_f0);
  if (local_f0.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
      super__Optional_payload<eos::render::Texture,_true,_false,_false>.
      super__Optional_payload_base<eos::render::Texture>._M_engaged == true) {
    local_f0.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
    super__Optional_payload<eos::render::Texture,_true,_false,_false>.
    super__Optional_payload_base<eos::render::Texture>._M_engaged = false;
    std::
    vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
    ::~vector((vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
               *)&local_f0);
  }
  if (local_c8.rasterizer.depthbuffer.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.rasterizer.depthbuffer.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.rasterizer.depthbuffer.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.rasterizer.depthbuffer.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.rasterizer.colorbuffer.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.rasterizer.colorbuffer.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.rasterizer.colorbuffer.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.rasterizer.colorbuffer.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.texture.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
      super__Optional_payload<eos::render::Texture,_true,_false,_false>.
      super__Optional_payload_base<eos::render::Texture>._M_engaged == true) {
    local_c8.texture.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
    super__Optional_payload<eos::render::Texture,_true,_false,_false>.
    super__Optional_payload_base<eos::render::Texture>._M_engaged = false;
    std::
    vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
    ::~vector((vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
               *)&local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

core::Image4u render(const core::Mesh& mesh, const Eigen::Matrix4f& model_view_matrix,
                     const Eigen::Matrix4f& projection_matrix, int viewport_width, int viewport_height,
                     Texture texture, bool enable_backface_culling = false, bool enable_near_clipping = true,
                     bool enable_far_clipping = true)
{
    SoftwareRenderer<VertexShader, TexturingFragmentShader> software_renderer(viewport_width,
                                                                              viewport_height);
    software_renderer.enable_backface_culling = enable_backface_culling;
    software_renderer.enable_near_clipping = enable_near_clipping;
    software_renderer.rasterizer.enable_far_clipping = enable_far_clipping;

    return software_renderer.render(mesh, model_view_matrix, projection_matrix, texture);
}